

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

Bool IsNodePushable(Node *node)

{
  Node *node_local;
  
  if (node->tag == (Dict *)0x0) {
    node_local._4_4_ = no;
  }
  else if ((node->tag->model & 0x10) == 0) {
    node_local._4_4_ = no;
  }
  else if ((node->tag->model & 0x800) == 0) {
    if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_INS)) &&
       (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_DEL)))) {
      node_local._4_4_ = yes;
    }
    else {
      node_local._4_4_ = no;
    }
  }
  else {
    node_local._4_4_ = no;
  }
  return node_local._4_4_;
}

Assistant:

static Bool IsNodePushable( Node *node )
{
    if (node->tag == NULL)
        return no;

    if (!(node->tag->model & CM_INLINE))
        return no;

    if (node->tag->model & CM_OBJECT)
        return no;

    /*\ Issue #92: OLD problem of ins and del which are marked as both
     *  inline and block, thus should NOT ever be 'inserted'
    \*/
    if (nodeIsINS(node) || nodeIsDEL(node))
        return no;

    return yes;
}